

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtimeline.cpp
# Opt level: O2

void QTimeLine::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QEasingCurve *curve;
  Direction *pDVar1;
  _func_int **pp_Var2;
  bool bVar3;
  Direction DVar4;
  long *plVar5;
  QBindableInterface *pQVar6;
  int msec;
  long in_FS_OFFSET;
  QTimeLine local_20;
  
  local_20.super_QObject.d_ptr.d = *(QObjectData **)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      if (*(QObjectData **)(in_FS_OFFSET + 0x28) == local_20.super_QObject.d_ptr.d) {
        valueChanged(*_a[1],_o);
        return;
      }
      break;
    case 1:
      if (*(QObjectData **)(in_FS_OFFSET + 0x28) == local_20.super_QObject.d_ptr.d) {
        frameChanged((QTimeLine *)_o,*_a[1]);
        return;
      }
      break;
    case 2:
      if (*(QObjectData **)(in_FS_OFFSET + 0x28) == local_20.super_QObject.d_ptr.d) {
        stateChanged((QTimeLine *)_o,*_a[1]);
        return;
      }
      break;
    case 3:
      if (*(QObjectData **)(in_FS_OFFSET + 0x28) == local_20.super_QObject.d_ptr.d) {
        finished((QTimeLine *)_o);
        return;
      }
      break;
    case 4:
      if (*(QObjectData **)(in_FS_OFFSET + 0x28) == local_20.super_QObject.d_ptr.d) {
        start((QTimeLine *)_o);
        return;
      }
      break;
    case 5:
      if (*(QObjectData **)(in_FS_OFFSET + 0x28) == local_20.super_QObject.d_ptr.d) {
        resume((QTimeLine *)_o);
        return;
      }
      break;
    case 6:
      if (*(QObjectData **)(in_FS_OFFSET + 0x28) == local_20.super_QObject.d_ptr.d) {
        stop((QTimeLine *)_o);
        return;
      }
      break;
    case 7:
      if (*(QObjectData **)(in_FS_OFFSET + 0x28) == local_20.super_QObject.d_ptr.d) {
        setPaused((QTimeLine *)_o,*_a[1]);
        return;
      }
      break;
    case 8:
      msec = *_a[1];
LAB_003a0ff8:
      if (*(QObjectData **)(in_FS_OFFSET + 0x28) == local_20.super_QObject.d_ptr.d) {
        setCurrentTime((QTimeLine *)_o,msec);
        return;
      }
      break;
    case 9:
      if (*(QObjectData **)(in_FS_OFFSET + 0x28) == local_20.super_QObject.d_ptr.d) {
        toggleDirection((QTimeLine *)_o);
        return;
      }
      break;
    default:
      goto switchD_003a0bd8_caseD_3;
    }
    goto LAB_003a1017;
  case ReadProperty:
    if ((uint)_id < 6) {
      pDVar1 = (Direction *)*_a;
      switch(_id) {
      case 0:
        DVar4 = duration((QTimeLine *)_o);
        break;
      case 1:
        DVar4 = updateInterval((QTimeLine *)_o);
        break;
      case 2:
        DVar4 = currentTime((QTimeLine *)_o);
        break;
      case 3:
        DVar4 = direction((QTimeLine *)_o);
        break;
      case 4:
        DVar4 = loopCount((QTimeLine *)_o);
        break;
      case 5:
        easingCurve(&local_20);
        pp_Var2 = *(_func_int ***)pDVar1;
        *(_func_int ***)pDVar1 = local_20.super_QObject._vptr_QObject;
        local_20.super_QObject._vptr_QObject = pp_Var2;
        QEasingCurve::~QEasingCurve((QEasingCurve *)&local_20);
        goto switchD_003a0bd8_caseD_3;
      }
      *pDVar1 = DVar4;
    }
    break;
  case WriteProperty:
    if ((uint)_id < 6) {
      curve = (QEasingCurve *)*_a;
      switch(_id) {
      case 0:
        if (*(QObjectData **)(in_FS_OFFSET + 0x28) == local_20.super_QObject.d_ptr.d) {
          setDuration((QTimeLine *)_o,*(int *)&curve->d_ptr);
          return;
        }
        break;
      case 1:
        if (*(QObjectData **)(in_FS_OFFSET + 0x28) == local_20.super_QObject.d_ptr.d) {
          setUpdateInterval((QTimeLine *)_o,*(int *)&curve->d_ptr);
          return;
        }
        break;
      case 2:
        msec = *(int *)&curve->d_ptr;
        goto LAB_003a0ff8;
      case 3:
        if (*(QObjectData **)(in_FS_OFFSET + 0x28) == local_20.super_QObject.d_ptr.d) {
          setDirection((QTimeLine *)_o,*(Direction *)&curve->d_ptr);
          return;
        }
        break;
      case 4:
        if (*(QObjectData **)(in_FS_OFFSET + 0x28) == local_20.super_QObject.d_ptr.d) {
          setLoopCount((QTimeLine *)_o,*(int *)&curve->d_ptr);
          return;
        }
        break;
      case 5:
        if (*(QObjectData **)(in_FS_OFFSET + 0x28) == local_20.super_QObject.d_ptr.d) {
          setEasingCurve((QTimeLine *)_o,curve);
          return;
        }
      }
      goto LAB_003a1017;
    }
    break;
  case IndexOfMethod:
    bVar3 = QtMocHelpers::indexOfMethod<void(QTimeLine::*)(double,QTimeLine::QPrivateSignal)>
                      ((QtMocHelpers *)_a,(void **)valueChanged,0,0);
    if (((!bVar3) &&
        (bVar3 = QtMocHelpers::indexOfMethod<void(QTimeLine::*)(int,QTimeLine::QPrivateSignal)>
                           ((QtMocHelpers *)_a,(void **)frameChanged,0,1), !bVar3)) &&
       (bVar3 = QtMocHelpers::
                indexOfMethod<void(QTimeLine::*)(QTimeLine::State,QTimeLine::QPrivateSignal)>
                          ((QtMocHelpers *)_a,(void **)stateChanged,0,2), !bVar3)) {
      if (*(QObjectData **)(in_FS_OFFSET + 0x28) == local_20.super_QObject.d_ptr.d) {
        QtMocHelpers::indexOfMethod<void(QTimeLine::*)(QTimeLine::QPrivateSignal)>
                  ((QtMocHelpers *)_a,(void **)finished,0,3);
        return;
      }
      goto LAB_003a1017;
    }
    break;
  case BindableProperty:
    switch(_id) {
    case 0:
      plVar5 = (long *)*_a;
      *plVar5 = (long)((long)&(_o->d_ptr).d[1].bindingStorage.bindingStatus + 4);
      pQVar6 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectCompatProperty<QTimeLinePrivate,_int,_&QTimeLinePrivate::_qt_property_duration_offset,_&QTimeLinePrivate::setDuration,_nullptr,_nullptr>,_void>
                ::iface;
      break;
    case 1:
      plVar5 = (long *)*_a;
      *plVar5 = (long)&(_o->d_ptr).d[2].q_ptr;
      pQVar6 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectBindableProperty<QTimeLinePrivate,_int,_&QTimeLinePrivate::_qt_property_updateInterval_offset,_nullptr>,_void>
                ::iface;
      break;
    case 2:
      plVar5 = (long *)*_a;
      *plVar5 = (long)((long)&(_o->d_ptr).d[2].parent + 4);
      pQVar6 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectCompatProperty<QTimeLinePrivate,_int,_&QTimeLinePrivate::_qt_property_currentTime_offset,_&QTimeLinePrivate::setCurrentTimeForwardToQ,_nullptr,_nullptr>,_void>
                ::iface;
      break;
    case 3:
      plVar5 = (long *)*_a;
      *plVar5 = (long)&(_o->d_ptr).d[2].children;
      pQVar6 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectCompatProperty<QTimeLinePrivate,_QTimeLine::Direction,_&QTimeLinePrivate::_qt_property_direction_offset,_&QTimeLinePrivate::setDirection,_nullptr,_nullptr>,_void>
                ::iface;
      break;
    case 4:
      plVar5 = (long *)*_a;
      *plVar5 = (long)((long)&(_o->d_ptr).d[2].q_ptr + 4);
      pQVar6 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectBindableProperty<QTimeLinePrivate,_int,_&QTimeLinePrivate::_qt_property_loopCount_offset,_nullptr>,_void>
                ::iface;
      break;
    case 5:
      plVar5 = (long *)*_a;
      *plVar5 = (long)&(_o->d_ptr).d[1].bindingStorage;
      pQVar6 = &QtPrivate::
                QBindableInterfaceForProperty<QObjectBindableProperty<QTimeLinePrivate,_QEasingCurve,_&QTimeLinePrivate::_qt_property_easingCurve_offset,_nullptr>,_void>
                ::iface;
      break;
    default:
      goto switchD_003a0bd8_caseD_3;
    }
    plVar5[1] = (long)pQVar6;
  }
switchD_003a0bd8_caseD_3:
  if (*(QObjectData **)(in_FS_OFFSET + 0x28) == local_20.super_QObject.d_ptr.d) {
    return;
  }
LAB_003a1017:
  __stack_chk_fail();
}

Assistant:

void QTimeLine::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTimeLine *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->valueChanged((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1])), QPrivateSignal()); break;
        case 1: _t->frameChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])), QPrivateSignal()); break;
        case 2: _t->stateChanged((*reinterpret_cast< std::add_pointer_t<QTimeLine::State>>(_a[1])), QPrivateSignal()); break;
        case 3: _t->finished(QPrivateSignal()); break;
        case 4: _t->start(); break;
        case 5: _t->resume(); break;
        case 6: _t->stop(); break;
        case 7: _t->setPaused((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 8: _t->setCurrentTime((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 9: _t->toggleDirection(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QTimeLine::*)(qreal , QPrivateSignal)>(_a, &QTimeLine::valueChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTimeLine::*)(int , QPrivateSignal)>(_a, &QTimeLine::frameChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTimeLine::*)(QTimeLine::State , QPrivateSignal)>(_a, &QTimeLine::stateChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTimeLine::*)(QPrivateSignal)>(_a, &QTimeLine::finished, 3))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->duration(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->updateInterval(); break;
        case 2: *reinterpret_cast<int*>(_v) = _t->currentTime(); break;
        case 3: *reinterpret_cast<Direction*>(_v) = _t->direction(); break;
        case 4: *reinterpret_cast<int*>(_v) = _t->loopCount(); break;
        case 5: *reinterpret_cast<QEasingCurve*>(_v) = _t->easingCurve(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setDuration(*reinterpret_cast<int*>(_v)); break;
        case 1: _t->setUpdateInterval(*reinterpret_cast<int*>(_v)); break;
        case 2: _t->setCurrentTime(*reinterpret_cast<int*>(_v)); break;
        case 3: _t->setDirection(*reinterpret_cast<Direction*>(_v)); break;
        case 4: _t->setLoopCount(*reinterpret_cast<int*>(_v)); break;
        case 5: _t->setEasingCurve(*reinterpret_cast<QEasingCurve*>(_v)); break;
        default: break;
        }
    }
    if (_c == QMetaObject::BindableProperty) {
        switch (_id) {
        case 0: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableDuration(); break;
        case 1: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableUpdateInterval(); break;
        case 2: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableCurrentTime(); break;
        case 3: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableDirection(); break;
        case 4: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableLoopCount(); break;
        case 5: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableEasingCurve(); break;
        default: break;
        }
    }
}